

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O1

Status * __thiscall
draco::StlEncoder::EncodeInternal(Status *__return_storage_ptr__,StlEncoder *this)

{
  float fVar1;
  char cVar2;
  EncoderBuffer *pEVar3;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var4;
  size_t __n;
  int i;
  uint uVar5;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar6;
  Mesh *pMVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  pointer paVar11;
  long lVar12;
  long lVar13;
  Scalar ret_2;
  float fVar14;
  uint16_t unused;
  uint32_t num_faces;
  Vector3f pos [3];
  VectorD<float,_3> r;
  Self ret_1;
  Self ret;
  string header_str;
  stringstream out;
  undefined2 local_25e;
  int local_25c;
  long *local_258;
  undefined8 uStack_250;
  long local_248;
  float afStack_240 [4];
  undefined8 local_230;
  float local_228;
  undefined1 local_224 [4];
  float local_220 [4];
  float local_210 [4];
  long local_200;
  Status *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  pointer local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x50;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"generated using Draco",0x15);
  std::__cxx11::stringbuf::str();
  if (this->out_buffer_->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>();
  }
  local_25c = (int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->in_mesh_->faces_).vector_.
                                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  pEVar3 = this->out_buffer_;
  if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar3,
               (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_25c,&local_258);
  }
  uVar5 = PointCloud::GetNamedAttributeId(&this->in_mesh_->super_PointCloud,POSITION);
  if ((int)uVar5 < 0) {
    local_258 = &local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"Mesh is missing the position attribute.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_258,uStack_250 + (long)local_258)
    ;
  }
  else {
    local_1f0 = (ulong)uVar5;
    if (*(int *)((long)(this->in_mesh_->super_PointCloud).attributes_.
                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
                       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       ._M_t + 0x1c) == 9) {
      local_25e = 0;
      local_1f8 = __return_storage_ptr__;
      if (this->in_mesh_ != (Mesh *)0x0) {
        pMVar7 = this->in_mesh_;
        paVar11 = (pMVar7->faces_).vector_.
                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(pMVar7->faces_).vector_.
                                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)paVar11) >> 2) *
            -0x55555555 != 0) {
          lVar12 = 0;
          uVar10 = 0;
          do {
            _Var4._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
                 (pMVar7->super_PointCloud).attributes_.
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
            local_248 = 0;
            afStack_240[0] = 0.0;
            afStack_240[1] = 0.0;
            local_258 = (long *)0x0;
            uStack_250 = 0;
            afStack_240[2] = 0.0;
            IVar6.value_ = paVar11[uVar10]._M_elems[0].value_;
            cVar2 = *(char *)((long)_Var4._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl + 100);
            if (cVar2 == '\0') {
              IVar6.value_ = *(uint *)(*(long *)((long)_Var4._M_t.
                                                                                                              
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + (ulong)IVar6.value_ * 4);
            }
            __n = *(size_t *)
                   ((long)_Var4._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28
                   );
            lVar13 = **(long **)_Var4._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                     + *(long *)((long)_Var4._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl + 0x30);
            local_200 = lVar12;
            local_1e8 = uVar10;
            memcpy(&local_258,(void *)(IVar6.value_ * __n + lVar13),__n);
            uVar8 = (ulong)paVar11[uVar10]._M_elems[1].value_;
            if (cVar2 == '\0') {
              uVar8 = (ulong)*(uint *)(*(long *)((long)_Var4._M_t.
                                                                                                              
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + uVar8 * 4);
            }
            local_1e0 = paVar11 + uVar10;
            memcpy((void *)((long)&uStack_250 + 4),(void *)(uVar8 * __n + lVar13),__n);
            lVar12 = local_200;
            uVar5 = local_1e0->_M_elems[2].value_;
            if (cVar2 == '\0') {
              uVar5 = *(uint *)(*(long *)((long)_Var4._M_t.
                                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                .
                                                super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                ._M_head_impl + 0x48) + (ulong)uVar5 * 4);
            }
            memcpy(afStack_240,(void *)(lVar13 + uVar5 * __n),__n);
            local_210[2] = 0.0;
            local_210[0] = 0.0;
            local_210[1] = 0.0;
            lVar13 = 0;
            do {
              local_210[lVar13] =
                   *(float *)((long)&uStack_250 + lVar13 * 4 + 4) -
                   *(float *)((long)&local_258 + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_220[2] = 0.0;
            local_220[0] = 0.0;
            local_220[1] = 0.0;
            lVar13 = 0;
            do {
              local_220[lVar13] = afStack_240[lVar13] - *(float *)((long)&local_258 + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_230 = CONCAT44(local_220[0] * local_210[2] - local_210[0] * local_220[2],
                                 local_220[2] * local_210[1] - local_210[2] * local_220[1]);
            local_228 = local_210[0] * local_220[1] - local_220[0] * local_210[1];
            fVar14 = 0.0;
            lVar13 = 0;
            do {
              fVar1 = *(float *)((long)&local_230 + lVar13 * 4);
              fVar14 = fVar14 + fVar1 * fVar1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (fVar14 < 0.0) {
              fVar14 = sqrtf(fVar14);
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              lVar13 = 0;
              do {
                *(float *)((long)&local_230 + lVar13 * 4) =
                     *(float *)((long)&local_230 + lVar13 * 4) / fVar14;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
            }
            pEVar3 = this->out_buffer_;
            if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar3,
                         (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_230,local_224);
            }
            lVar13 = 0;
            do {
              uVar5 = *(uint *)((long)(paVar11->_M_elems + lVar13) + lVar12);
              if (*(char *)((long)_Var4._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 100) == '\0') {
                uVar5 = *(uint *)(*(long *)((long)_Var4._M_t.
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + (ulong)uVar5 * 4);
              }
              pEVar3 = this->out_buffer_;
              if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
                lVar9 = (ulong)uVar5 *
                        *(long *)((long)_Var4._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x28) +
                        **(long **)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl +
                        *(long *)((long)_Var4._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x30);
                std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                          ((vector<char,std::allocator<char>> *)pEVar3,
                           (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data._M_finish,lVar9,
                           *(long *)((long)_Var4._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl + 0x28) + lVar9);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            pEVar3 = this->out_buffer_;
            if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar3,
                         (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_25e,&local_25c);
            }
            uVar10 = local_1e8 + 1;
            pMVar7 = this->in_mesh_;
            paVar11 = (pMVar7->faces_).vector_.
                      super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0xc;
          } while (uVar10 < (uint)((int)((ulong)((long)(pMVar7->faces_).vector_.
                                                                                                              
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)paVar11) >> 2) * -0x55555555));
        }
      }
      local_1f8->code_ = OK;
      (local_1f8->error_msg_)._M_dataplus._M_p = (pointer)&(local_1f8->error_msg_).field_2;
      (local_1f8->error_msg_)._M_string_length = 0;
      (local_1f8->error_msg_).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__ = local_1f8;
      goto LAB_0011cc58;
    }
    local_258 = &local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"Mesh position attribute is not of type float32.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_258,uStack_250 + (long)local_258)
    ;
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
LAB_0011cc58:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeInternal() {
  // Write STL header.
  std::stringstream out;
  out << std::left << std::setw(80)
      << "generated using Draco";  // header is 80 bytes fixed size.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  uint32_t num_faces = in_mesh_->num_faces();
  buffer()->Encode(&num_faces, 4);

  std::vector<uint8_t> stl_face;

  const int pos_att_id =
      in_mesh_->GetNamedAttributeId(GeometryAttribute::POSITION);

  if (pos_att_id < 0) {
    return ErrorStatus("Mesh is missing the position attribute.");
  }

  if (in_mesh_->attribute(pos_att_id)->data_type() != DT_FLOAT32) {
    return ErrorStatus("Mesh position attribute is not of type float32.");
  }

  uint16_t unused = 0;

  if (in_mesh_) {
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      const auto &f = in_mesh_->face(i);
      const auto *const pos_att = in_mesh_->attribute(pos_att_id);

      // The normal attribute can contain arbitrary normals that may not
      // correspond to the winding of the face.
      // Therefor we simply always calculate them
      // using the points of the triangle face: norm(cross(p2-p1, p3-p1))

      Vector3f pos[3];
      pos_att->GetMappedValue(f[0], &pos[0][0]);
      pos_att->GetMappedValue(f[1], &pos[1][0]);
      pos_att->GetMappedValue(f[2], &pos[2][0]);
      Vector3f norm = CrossProduct(pos[1] - pos[0], pos[2] - pos[0]);
      norm.Normalize();
      buffer()->Encode(norm.data(), sizeof(float) * 3);

      for (int c = 0; c < 3; ++c) {
        buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(f[c])),
                         pos_att->byte_stride());
      }

      buffer()->Encode(&unused, 2);
    }
  }
  return OkStatus();
}